

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O1

void __thiscall gui::Group::handleMouseMove(Group *this)

{
  Vector2f *in_RSI;
  
  handleMouseMove((Group *)((long)&this[-1].super_Container.super_Widget.name_.m_string.field_2 + 8)
                  ,in_RSI);
  return;
}

Assistant:

bool Group::handleMouseMove(const sf::Vector2f& mouseParent) {
    auto mouseLocal = toLocalSpace(mouseParent);
    auto widget = getWidgetUnderMouse(mouseLocal);
    if (widget == nullptr || !widget->handleMouseMove(mouseLocal)) {
        return baseClass::handleMouseMove(mouseParent);
    } else {
        return true;
    }
}